

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDc2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_4c;
  int c;
  int fPower;
  int fFanout;
  int fUpdateLevel;
  int fVerbose;
  int fBalance;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fUpdateLevel = 0;
  fFanout = 0;
  fPower = 0;
  c = 1;
  local_4c = 0;
  Extra_UtilGetoptReset();
LAB_0027b98a:
  iVar1 = Extra_UtilGetopt(argc,argv,"blfpvh");
  if (iVar1 == -1) {
    if (pAVar2 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar1 = Abc_NtkIsStrash(pAVar2);
      if (iVar1 == 0) {
        Abc_Print(-1,"This command works only for strashed networks.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        pAVar2 = Abc_NtkDC2(pAVar2,fUpdateLevel,fPower,c,local_4c,fFanout);
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Command has failed.\n");
          pAbc_local._4_4_ = 0;
        }
        else {
          Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
          pAbc_local._4_4_ = 0;
        }
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar1) {
  case 0x62:
    fUpdateLevel = fUpdateLevel ^ 1;
    goto LAB_0027b98a;
  default:
    break;
  case 0x66:
    c = c ^ 1;
    goto LAB_0027b98a;
  case 0x68:
    break;
  case 0x6c:
    fPower = fPower ^ 1;
    goto LAB_0027b98a;
  case 0x70:
    local_4c = local_4c ^ 1;
    goto LAB_0027b98a;
  case 0x76:
    goto switchD_0027b9c8_caseD_76;
  }
  Abc_Print(-2,"usage: dc2 [-blfpvh]\n");
  Abc_Print(-2,"\t         performs combinational AIG optimization\n");
  pcVar3 = "no";
  if (fUpdateLevel != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-b     : toggle internal balancing [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (fPower != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-l     : toggle updating level [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (c != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-f     : toggle representing fanouts [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (local_4c != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-p     : toggle power-aware rewriting [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (fFanout != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_0027b9c8_caseD_76:
  fFanout = fFanout ^ 1;
  goto LAB_0027b98a;
}

Assistant:

int Abc_CommandDc2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fBalance, fVerbose, fUpdateLevel, fFanout, fPower, c;

    extern Abc_Ntk_t * Abc_NtkDC2( Abc_Ntk_t * pNtk, int fBalance, int fUpdateLevel, int fFanout, int fPower, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fBalance     = 0;
    fVerbose     = 0;
    fUpdateLevel = 0;
    fFanout      = 1;
    fPower       = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "blfpvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'b':
            fBalance ^= 1;
            break;
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'f':
            fFanout ^= 1;
            break;
        case 'p':
            fPower ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }
    pNtkRes = Abc_NtkDC2( pNtk, fBalance, fUpdateLevel, fFanout, fPower, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: dc2 [-blfpvh]\n" );
    Abc_Print( -2, "\t         performs combinational AIG optimization\n" );
    Abc_Print( -2, "\t-b     : toggle internal balancing [default = %s]\n", fBalance? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle updating level [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle representing fanouts [default = %s]\n", fFanout? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle power-aware rewriting [default = %s]\n", fPower? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}